

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O2

void __thiscall helics::CallbackFederate::loadOperator(CallbackFederate *this)

{
  undefined1 *this_00;
  undefined4 uVar1;
  _func_int *p_Var2;
  long *plVar3;
  undefined1 uVar4;
  __shared_ptr<helics::FederateOperator,(__gnu_cxx::_Lock_policy)2> local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  CallbackFederate *local_60;
  __shared_ptr<helics::CallbackFederateOperator,_(__gnu_cxx::_Lock_policy)2> local_58;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_60 = this;
  std::make_shared<helics::CallbackFederateOperator,helics::CallbackFederate*>
            ((CallbackFederate **)&local_58);
  this_00 = &(this->super_CombinationFederate).super_ValueFederate.field_0x20;
  std::__shared_ptr<helics::CallbackFederateOperator,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<helics::CallbackFederateOperator,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             &local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  p_Var2 = (this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3];
  plVar3 = *(long **)(&(this->super_CombinationFederate).super_ValueFederate.field_0x18 +
                     (long)p_Var2);
  uVar1 = *(undefined4 *)
           (&(this->super_CombinationFederate).super_ValueFederate.field_0x10 + (long)p_Var2);
  std::__shared_ptr<helics::FederateOperator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<helics::CallbackFederateOperator,void>
            (local_70,(__shared_ptr<helics::CallbackFederateOperator,_(__gnu_cxx::_Lock_policy)2> *)
                      this_00);
  (**(code **)(*plVar3 + 0x2b0))(plVar3,uVar1,local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  p_Var2 = (this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3];
  plVar3 = *(long **)(&(this->super_CombinationFederate).super_ValueFederate.field_0x18 +
                     (long)p_Var2);
  (**(code **)(*plVar3 + 0x110))
            (plVar3,*(undefined4 *)
                     (&(this->super_CombinationFederate).super_ValueFederate.field_0x10 +
                     (long)p_Var2),0x67,1);
  p_Var2 = (this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3];
  plVar3 = *(long **)(&(this->super_CombinationFederate).super_ValueFederate.field_0x18 +
                     (long)p_Var2);
  uVar4 = (**(code **)(*plVar3 + 0x118))
                    (plVar3,*(undefined4 *)
                             (&(this->super_CombinationFederate).super_ValueFederate.field_0x10 +
                             (long)p_Var2),0x51);
  (this->super_CombinationFederate).super_ValueFederate.field_0x30 = uVar4;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/CallbackFederate.cpp:91:19)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/CallbackFederate.cpp:91:19)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  Federate::setAsyncCheck
            ((Federate *)
             ((long)&(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate +
             (long)(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]),
             (function<bool_()> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

void CallbackFederate::loadOperator()
{
    op = std::make_shared<CallbackFederateOperator>(this);
    coreObject->setFederateOperator(getID(), op);
    coreObject->setFlagOption(getID(), HELICS_FLAG_CALLBACK_FEDERATE, true);
    mEventTriggered = coreObject->getFlagOption(getID(), HELICS_FLAG_EVENT_TRIGGERED);
    setAsyncCheck([this]() { return (getCurrentMode() >= Modes::FINALIZE); });
}